

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O2

void flush(NMQ *q)

{
  dlist *list;
  int iVar1;
  char cVar2;
  uint32_t uVar3;
  dlist_s *pdVar4;
  int8_t iVar5;
  uint uVar6;
  int iVar7;
  segment *psVar8;
  char *pcVar9;
  int64_t iVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t *puVar14;
  long lVar15;
  dlist_s *node;
  segment *s;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint32_t local_6a4;
  char buf [1600];
  ulong uVar10;
  
  if ((q->probe_pending != '\0') && (q->ts_probe_wait <= q->current)) {
    do_window_probe_or_answer(q,3);
  }
  uVar10 = (ulong)q->ackcount;
  if (uVar10 == 0) {
    if (q->ack_failures != 0) {
      window_probe_ans2peer(q);
    }
    q->ack_failures = 0;
  }
  else {
    uVar16 = q->MSS;
    for (lVar15 = 0; uVar10 << 3 != lVar15; lVar15 = lVar15 + 8) {
      decode_uint32((uint32_t *)buf,(char *)((long)q->acklist + lVar15));
    }
    uVar6 = uVar16 >> 3;
    psVar8 = obtain_segment(&q->pool);
    psVar8->sn = 0;
    psVar8->conv = q->conv;
    psVar8->cmd = '\x02';
    psVar8->una = q->rcv_nxt;
    psVar8->len = 0;
    psVar8->wnd = (short)q->MAX_RCV_BUF_NUM - (short)q->nrcv_buf;
    psVar8->frag = '\0';
    psVar8->sendts = 0;
    puVar14 = q->acklist;
    memset(buf,0,0x640);
    uVar16 = uVar16 & 0xfffffff8;
    while (uVar18 = (uint)uVar10, uVar18 != 0) {
      uVar17 = uVar18 - uVar6;
      if (uVar18 < uVar6 || uVar17 == 0) {
        uVar10 = (ulong)(uVar18 << 3);
        psVar8->len = uVar18 << 3;
        memcpy(psVar8->data,puVar14,uVar10);
        uVar17 = 0;
      }
      else {
        psVar8->len = uVar16;
        memcpy(psVar8->data,puVar14,(ulong)uVar16);
        uVar10 = (ulong)uVar16;
      }
      puVar14 = (uint32_t *)((long)puVar14 + uVar10);
      pcVar9 = encode_seg_and_data(psVar8,buf);
      nmq_output(q,buf,(int)pcVar9 - (int)buf);
      uVar10 = (ulong)uVar17;
    }
    recycle_segment(&q->pool,psVar8);
    q->ackcount = 0;
    q->ack_failures = 0;
  }
  uVar10 = MIN((ulong)q->MAX_SND_BUF_NUM,(ulong)q->rmt_wnd);
  iVar7 = (int)uVar10;
  if (q->fc_on != '\0') {
    iVar11 = MIN(uVar10 & 0xffffffff,(ulong)(q->fc).cwnd);
    iVar7 = (int)iVar11;
  }
  list = &q->snd_buf;
  node = (q->snd_que).next;
  while ((node != &q->snd_que && (uVar16 = q->snd_nxt, uVar16 < q->snd_una + iVar7))) {
    pdVar4 = node->next;
    q->snd_nxt = uVar16 + 1;
    *(uint *)&node[2].next = uVar16;
    dlist_remove_node(node);
    dlist_add_tail(list,node);
    q->snd_sn_to_node
    [(ulong)(*(int *)&node[2].next + q->MAX_SND_BUF_NUM) % (ulong)q->MAX_SND_BUF_NUM] = node;
    q->nsnd_que = q->nsnd_que - 1;
    node = pdVar4;
  }
  uVar16 = q->current;
  uVar12 = q->MAX_RCV_BUF_NUM;
  uVar3 = q->nrcv_buf;
  cVar2 = (q->fc).DUP_ACK_LIM;
  pcVar9 = buf;
  iVar1 = 0;
  memset(pcVar9,0,0x640);
  local_6a4 = 0;
  uVar6 = 0;
  iVar7 = 0;
  psVar8 = (segment *)(q->snd_buf).next;
  while (s = psVar8, s != (segment *)list) {
    psVar8 = (segment *)(s->head).next;
    if (s->n_sent == 0) {
      uVar13 = q->rto;
      s->rto = uVar13;
      goto LAB_00101616;
    }
    if (s->resendts <= uVar16) {
      local_6a4 = s->sn;
      uVar13 = (q->rto >> (q->nodelay != '\0')) + s->rto;
      if (59999 < (int)uVar13) {
        uVar13 = 60000;
      }
      s->rto = uVar13;
      iVar1 = iVar1 + 1;
      s->dupacks = 0;
      goto LAB_00101616;
    }
    if ((int)cVar2 <= (int)(uint)s->dupacks) {
      local_6a4 = s->sn;
      s->rto = 200;
      iVar7 = iVar7 + 1;
      s->dupacks = 0;
      uVar13 = 200;
LAB_00101616:
      uVar18 = s->len;
      if ((q->steady_on != '\0') && (uVar6 = uVar6 + uVar18 + 0x18, q->BYTES_PER_FLUSH < uVar6))
      break;
      s->n_sent = s->n_sent + 1;
      s->wnd = (short)uVar12 - (short)uVar3;
      s->una = q->rcv_nxt;
      s->sendts = uVar16;
      s->resendts = uVar13 + uVar16;
      if ((long)(ulong)q->MSS <= (long)(((long)pcVar9 - (long)buf) + (ulong)uVar18)) {
        nmq_output(q,buf,(int)((long)pcVar9 - (long)buf));
        uVar18 = s->len;
        pcVar9 = buf;
      }
      puVar14 = &(q->stat).bytes_send_tot;
      *puVar14 = *puVar14 + uVar18;
      pcVar9 = encode_seg_and_data(s,pcVar9);
      if (((q->MAX_PKT_TRY < s->n_sent) && (q->state == -1)) &&
         (q->failure_cb != (_func_void_nmq_s_ptr_uint32_t *)0x0)) {
        (*q->failure_cb)(q,s->sn);
      }
    }
  }
  if (buf < pcVar9) {
    nmq_output(q,buf,(int)pcVar9 - (int)buf);
  }
  if (((iVar1 + iVar7 != 0) && ((q->fc).in_trouble == '\0')) &&
     ((uint)(q->fc).TROUBLE_TOLERANCE <= (uint)(iVar1 + iVar7))) {
    (q->fc).in_trouble = '\x01';
    (q->fc).max_lost_sn = local_6a4;
    iVar11 = MAX(2,(long)((float)(q->fc).cwnd * (q->fc).ssth_alpha));
    uVar12 = (uint32_t)iVar11;
    (q->fc).ssthresh = uVar12;
    (q->fc).cwnd = uVar12;
    if (iVar7 != 0) {
      uVar12 = (int)(q->fc).DUP_ACK_LIM + uVar12;
      (q->fc).cwnd = uVar12;
    }
    (q->fc).incr = (float)(uVar12 * (q->fc).MSS);
  }
  rcvbuf2q(q);
  if ((q->rmt_wnd == 0) && (q->probe_pending == '\0')) {
    q->probe_pending = '\x01';
    q->ts_probe_wait = q->current + 500;
  }
  if (q->fin_sn != '\0') {
    iVar5 = list_not_empty(&q->snd_que);
    if (iVar5 == '\0') {
      iVar5 = list_not_empty(list);
      if (iVar5 == '\0') {
        nmq_output(q,(char *)0x0,-1);
      }
    }
  }
  return;
}

Assistant:

static void flush(NMQ *q) {

    window_probe_req2peer_if_need(q);

    acks2peer(q);

    sndq2buf(q);

    flush_snd_buf(q);

    rcvbuf2q(q);

    window_probe_build_req_if_need(q);

    check_send_done(q);
}